

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_pipe.c
# Opt level: O3

int nni_plat_pipe_open(int *wfd,int *rfd)

{
  int iVar1;
  int *piVar2;
  int local_20;
  int local_1c;
  int fds [2];
  
  iVar1 = pipe(&local_20);
  if (iVar1 < 0) {
    piVar2 = __errno_location();
    iVar1 = nni_plat_errno(*piVar2);
  }
  else {
    *wfd = local_1c;
    *rfd = local_20;
    iVar1 = 0;
    fcntl(local_20,2,1);
    fcntl(local_1c,2,1);
    fcntl(local_20,4,0x800);
    fcntl(local_1c,4,0x800);
  }
  return iVar1;
}

Assistant:

int
nni_plat_pipe_open(int *wfd, int *rfd)
{
	int fds[2];

	if (pipe(fds) < 0) {
		return (nni_plat_errno(errno));
	}
	*wfd = fds[1];
	*rfd = fds[0];

	(void) fcntl(fds[0], F_SETFD, FD_CLOEXEC);
	(void) fcntl(fds[1], F_SETFD, FD_CLOEXEC);
	(void) fcntl(fds[0], F_SETFL, O_NONBLOCK);
	(void) fcntl(fds[1], F_SETFL, O_NONBLOCK);

	return (0);
}